

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsBlurEffect::draw(QGraphicsBlurEffect *this,QPainter *painter)

{
  QGraphicsBlurEffectPrivate *pQVar1;
  ulong uVar2;
  QGraphicsEffect *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  PixmapPadMode mode;
  QGraphicsBlurEffectPrivate *d;
  QPixmap pixmap;
  QPoint offset;
  QPoint *in_stack_ffffffffffffff68;
  QPoint *in_stack_ffffffffffffff70;
  QPointF *this_00;
  PixmapPadMode mode_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  QRectF local_58;
  undefined1 local_38 [16];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  mode_00 = (PixmapPadMode)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QGraphicsBlurEffect *)0x4a4925);
  qVar3 = QPixmapBlurFilter::radius((QPixmapBlurFilter *)in_stack_ffffffffffffff70);
  if (1.0 <= qVar3) {
    uVar4 = 2;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint(in_stack_ffffffffffffff70);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsEffect::sourcePixmap
              (in_RSI,(CoordinateSystem)((ulong)pQVar1 >> 0x20),
               (QPoint *)CONCAT44(uVar4,in_stack_ffffffffffffff88),mode_00);
    uVar2 = QPixmap::isNull();
    if ((uVar2 & 1) == 0) {
      this_00 = (QPointF *)pQVar1->filter;
      QPointF::QPointF(this_00,in_stack_ffffffffffffff68);
      QRectF::QRectF(&local_58);
      (**(code **)((long)this_00->xp + 0x68))(this_00,in_RSI,local_38,&local_28,&local_58);
    }
    QPixmap::~QPixmap((QPixmap *)&local_28);
  }
  else {
    QGraphicsEffect::drawSource
              ((QGraphicsEffect *)in_stack_ffffffffffffff70,(QPainter *)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsBlurEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsBlurEffect);
    if (d->filter->radius() < 1) {
        drawSource(painter);
        return;
    }

    PixmapPadMode mode = PadToEffectiveBoundingRect;

    QPoint offset;
    QPixmap pixmap = sourcePixmap(Qt::LogicalCoordinates, &offset, mode);
    if (pixmap.isNull())
        return;

    d->filter->draw(painter, offset, pixmap);
}